

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hint_source.cpp
# Opt level: O2

HintSource *
HintSource::from_json
          (Json *json,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
          *nodes)

{
  value_t vVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Position PVar5;
  const_reference pvVar6;
  mapped_type *ppWVar7;
  HintSource *this;
  uint8_t orientation;
  mapped_type node;
  allocator<char> local_15b;
  allocator<char> local_15a;
  bool local_159;
  string orientation_str;
  key_type local_138;
  string node_id;
  key_type local_f8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> map_ids;
  vector<unsigned_short,_std::allocator<unsigned_short>_> text_ids;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_a0;
  string description;
  string local_68;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  ulong uVar8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&node_id,"description",(allocator<char> *)&orientation_str);
  pvVar6 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&node_id);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&description,pvVar6);
  std::__cxx11::string::~string((string *)&node_id);
  text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[8],_0>(json,(char (*) [8])"textIds");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&node_id,"textIds",(allocator<char> *)&orientation_str);
    pvVar6 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&node_id);
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_0>
              (pvVar6,&text_ids);
    std::__cxx11::string::~string((string *)&node_id);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&node_id,"smallTextbox",(allocator<char> *)&orientation_str);
  local_138._M_dataplus._M_p._0_1_ = 0;
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::value<bool,_0>(json,&node_id,(bool *)&local_138);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&orientation_str,"nodeId",(allocator<char> *)&local_138);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::value(&node_id,json,&orientation_str,"");
  std::__cxx11::string::~string((string *)&orientation_str);
  if (node_id._M_string_length == 0) {
    node = (WorldNode *)0x0;
  }
  else {
    ppWVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
              ::at(nodes,&node_id);
    node = *ppWVar7;
  }
  map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(json,(char (*) [7])0x1ea36b);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&orientation_str,"entity",(allocator<char> *)&local_f8);
    pvVar6 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&orientation_str);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"mapId",&local_15b);
    pvVar6 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar6,&local_138);
    vVar1 = pvVar6->m_type;
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&orientation_str);
    if (vVar1 == array) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&orientation_str,"entity",(allocator<char> *)&local_f8);
      pvVar6 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,&orientation_str);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"mapId",&local_15b);
      pvVar6 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pvVar6,&local_138);
      nlohmann::detail::
      from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_0>
                (pvVar6,&map_ids);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&orientation_str,"entity",&local_15b);
      pvVar6 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,&orientation_str);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"mapId",&local_15a);
      pvVar6 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pvVar6,&local_138);
      local_f8._M_dataplus._M_p._0_2_ =
           nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::get_impl<unsigned_short,_0>(pvVar6);
      std::vector<unsigned_short,std::allocator<unsigned_short>>::
      _M_assign_aux<unsigned_short_const*>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)&map_ids,&local_f8);
    }
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&orientation_str);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&orientation_str,"entity",(allocator<char> *)&local_f8);
    pvVar6 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&orientation_str);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"position",&local_15b);
    pvVar6 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar6,&local_138);
    PVar5 = Position::from_json(pvVar6);
    uVar8 = (ulong)(uint6)PVar5;
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&orientation_str);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"entity",&local_15b);
    pvVar6 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_138);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"orientation",&local_15a)
    ;
    pvVar6 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar6,&local_f8);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&orientation_str,pvVar6);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_138);
    bVar3 = std::operator==(&orientation_str,"sw");
    orientation = '\x02';
    if (!bVar3) {
      bVar3 = std::operator==(&orientation_str,"se");
      orientation = '\x01';
      if (!bVar3) {
        bVar3 = std::operator==(&orientation_str,"ne");
        if (bVar3) {
          orientation = '\0';
        }
        else {
          bVar3 = std::operator==(&orientation_str,"nw");
          orientation = '\x03';
          if (!bVar3) {
            iVar4 = std::__cxx11::stoi(&orientation_str,(size_t *)0x0,10);
            orientation = (uint8_t)iVar4;
          }
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"entity",&local_15b);
    pvVar6 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_138);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"highPalette",&local_15a)
    ;
    local_159 = false;
    bVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::value<bool,_0>(pvVar6,&local_f8,&local_159);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&orientation_str);
  }
  else {
    uVar8 = 0;
    bVar3 = false;
    orientation = '\0';
  }
  this = (HintSource *)operator_new(0x90);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a0,&text_ids);
  std::__cxx11::string::string((string *)&local_68,&description);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,&map_ids);
  HintSource(this,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a0,&local_68,
             node,bVar2,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,
             SUB86(uVar8,0),orientation,bVar3);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_a0);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::__cxx11::string::~string((string *)&node_id);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::__cxx11::string::~string((string *)&description);
  return this;
}

Assistant:

HintSource* HintSource::from_json(const Json& json, const std::map<std::string, WorldNode*>& nodes)
{
    std::string description = json.at("description");

    std::vector<uint16_t> text_ids;
    if(json.contains("textIds"))
        json.at("textIds").get_to(text_ids);

    bool small_textbox = json.value("smallTextbox", false);

    WorldNode* node = nullptr;
    std::string node_id = json.value("nodeId", "");
    if(!node_id.empty())
        node = nodes.at(node_id);

    std::vector<uint16_t> map_ids;
    Position position;
    uint8_t orientation = 0;
    bool high_palette = false;
    if(json.contains("entity"))
    {
        if(json.at("entity").at("mapId").is_array())
            json.at("entity").at("mapId").get_to(map_ids);
        else
            map_ids = { json.at("entity").at("mapId") };

        position = Position::from_json(json.at("entity").at("position"));

        std::string orientation_str = json.at("entity").at("orientation");
        if(orientation_str == "sw")
            orientation = ENTITY_ORIENTATION_SW;
        else if(orientation_str == "se")
            orientation = ENTITY_ORIENTATION_SE;
        else if(orientation_str == "ne")
            orientation = ENTITY_ORIENTATION_NE;
        else if(orientation_str == "nw")
            orientation = ENTITY_ORIENTATION_NW;
        else
            orientation = std::stoi(orientation_str);

        high_palette = json.at("entity").value("highPalette", false);
    }

    return new HintSource(text_ids, description, node, small_textbox, map_ids, position, orientation, high_palette);
}